

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall util_tests::util_overflow::test_method(util_overflow *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  iterator pvVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  check_type cVar3;
  undefined4 local_280;
  undefined4 local_27c;
  undefined4 **local_278;
  undefined1 *local_270;
  undefined4 **local_268;
  char *local_260;
  undefined8 local_258;
  undefined1 *local_250;
  undefined8 local_248;
  char *local_240;
  undefined8 *local_238;
  undefined1 *local_230;
  uint **local_228;
  undefined1 *local_220;
  undefined8 ***local_218;
  undefined1 *local_210;
  undefined8 local_208;
  undefined1 *local_200;
  uint ****local_1f8;
  undefined1 *local_1f0;
  uint *local_1e8;
  char *local_1e0;
  uint **local_1d8;
  undefined1 *local_1d0;
  uint *local_1c8;
  char *local_1c0;
  uint **local_1b8;
  undefined1 *local_1b0;
  uint *local_1a8;
  char *local_1a0;
  undefined1 local_198 [16];
  undefined1 *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  uint MAXI;
  undefined4 *local_f0;
  assertion_result local_e8;
  uint *****local_d0;
  undefined4 *local_c8;
  lazy_ostream local_c0;
  undefined1 *local_b0;
  lazy_ostream *local_a8;
  char *local_a0;
  char *local_98;
  assertion_result local_90;
  uint *local_78;
  char *local_70;
  undefined8 **local_68;
  char *local_60;
  uint ***local_58;
  char *local_50;
  uint ***local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  MAXI = 0xffffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6fcc63;
  file.m_end = (iterator)0x245;
  file.m_begin = (iterator)&local_108;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_118,msg);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(T{1}, MAXI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_128,0x245);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6fcd39;
  file_00.m_end = (iterator)0x246;
  file_00.m_begin = (iterator)&local_138;
  msg_00.m_end = pvVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(MAXI, MAXI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_158,0x246);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x247;
  file_01.m_begin = (iterator)&local_168;
  msg_01.m_end = pvVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
             msg_01);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,0xffffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_a8 = (lazy_ostream *)&local_1a8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1b8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_1b8 = &local_1c8;
  local_1a8 = &MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x247,
             &local_c0,"SaturatingAdd(T{1}, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1a8 = (uint *)0xf73098;
  local_1a0 = "";
  local_1b8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x248;
  file_02.m_begin = (iterator)&local_1a8;
  msg_02.m_end = pvVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b8,
             msg_02);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_1e8 = (uint *)CONCAT44(local_1e8._4_4_,0xffffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1d8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_1d8 = &local_1e8;
  local_1c8 = &MAXI;
  local_a8 = (lazy_ostream *)&local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x248,
             &local_c0,"SaturatingAdd(MAXI, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1c8 = (uint *)0xf73098;
  local_1c0 = "";
  local_1d8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x24a;
  file_03.m_begin = (iterator)&local_1c8;
  msg_03.m_end = pvVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8,
             msg_03);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_1e8 = (uint *)&local_208;
  local_208 = (uint ****)((ulong)local_208._4_4_ << 0x20);
  local_1f8 = &local_48;
  local_48 = (uint ***)0x100000000;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_1f8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_a8 = (lazy_ostream *)&local_1e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xfc43f0,(size_t)&local_a0,0x24a,
             &local_c0,"CheckedAdd(T{0}, T{0}).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1e8 = (uint *)0xf73098;
  local_1e0 = "";
  local_1f8 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x24b;
  file_04.m_begin = (iterator)&local_1e8;
  msg_04.m_end = pvVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1f8,
             msg_04);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_180 = "";
  local_58 = (uint ***)0x1ffffffff;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_48;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_208;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_208 = &local_58;
  local_48 = (uint ***)&MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24b,
             &local_c0,"CheckedAdd(T{0}, MAXI).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_48 = (uint ***)0xf73098;
  local_40 = "";
  local_208 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x24c;
  file_05.m_begin = (iterator)&local_48;
  msg_05.m_end = pvVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_208,
             msg_05);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_218 = &local_68;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_68 = (undefined8 **)0x1ffffffff;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_218;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_a8 = (lazy_ostream *)&local_58;
  local_58 = (uint ***)&MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24c,
             &local_c0,"CheckedAdd(T{1}, MAXI - 1).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58 = (uint ***)0xf73098;
  local_50 = "";
  local_218 = (undefined8 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x24d;
  file_06.m_begin = (iterator)&local_58;
  msg_06.m_end = pvVar2;
  msg_06.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_218,
             msg_06);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_68 = &local_238;
  local_238 = (undefined8 *)CONCAT44(local_238._4_4_,0xfffffffe);
  local_78 = (uint *)0x1fffffffe;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_68;
  local_d0 = (uint *****)&local_228;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_228 = &local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b4a2,(size_t)&local_a0,0x24d,
             &local_c0,"CheckedAdd(T{1}, MAXI - 2).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_68 = (undefined8 **)0xf73098;
  local_60 = "";
  local_228 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x24e;
  file_07.m_begin = (iterator)&local_68;
  msg_07.m_end = pvVar2;
  msg_07.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_228,
             msg_07);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_248 = (char *)((ulong)local_248._4_4_ << 0x20);
  local_238 = &local_258;
  local_258 = (undefined4 ***)((ulong)local_258._4_4_ << 0x20);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_238;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_a8 = (lazy_ostream *)&local_78;
  local_78 = (uint *)&local_248;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xfc43f0,(size_t)&local_a0,0x24e,
             &local_c0,"SaturatingAdd(T{0}, T{0})",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_78 = (uint *)0xf73098;
  local_70 = "";
  local_238 = (undefined8 *)&boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x24f;
  file_08.m_begin = (iterator)&local_78;
  msg_08.m_end = pvVar2;
  msg_08.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_238,
             msg_08);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_180 = "";
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,0xffffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_258;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_258 = &local_268;
  local_248 = (char *)&MAXI;
  local_a8 = (lazy_ostream *)&local_248;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24f,
             &local_c0,"SaturatingAdd(T{0}, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (undefined4 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x250;
  file_09.m_begin = (iterator)&local_248;
  msg_09.m_end = pvVar2;
  msg_09.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_258,
             msg_09);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0xffffffff);
  local_c8 = (undefined4 *)CONCAT44(local_c8._4_4_,0xffffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_278;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_278 = &local_c8;
  local_268 = (undefined4 **)&MAXI;
  local_a8 = (lazy_ostream *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x250,
             &local_c0,"SaturatingAdd(T{1}, MAXI - 1)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_268 = (undefined4 **)0xf73098;
  local_260 = "";
  local_278 = (undefined4 **)&boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x251;
  file_10.m_begin = (iterator)&local_268;
  msg_10.m_end = pvVar2;
  msg_10.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_278,
             msg_10);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_c8 = &local_27c;
  local_27c = 0xfffffffe;
  local_f0 = &local_280;
  local_280 = 0xfffffffe;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae108;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_f0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_a8 = (lazy_ostream *)&local_c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b4a2,(size_t)&local_a0,0x251,
             &local_c0,"SaturatingAdd(T{1}, MAXI - 2)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  MAXI = 0x7fffffff;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6fdb89;
  file_11.m_end = (iterator)0x245;
  file_11.m_begin = (iterator)&local_108;
  msg_11.m_end = pvVar2;
  msg_11.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_118,
             msg_11);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(T{1}, MAXI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_128,0x245);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6fdc4a;
  file_12.m_end = (iterator)0x246;
  file_12.m_begin = (iterator)&local_138;
  msg_12.m_end = pvVar2;
  msg_12.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_148,
             msg_12);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(MAXI, MAXI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_158,0x246);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x247;
  file_13.m_begin = (iterator)&local_168;
  msg_13.m_end = pvVar2;
  msg_13.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_178,
             msg_13);
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1b8;
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_c0.m_empty = false;
  local_180 = "";
  local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,0x7fffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1a8;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_1b8 = &local_1c8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_1a8 = &MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x247,
             &local_c0,"SaturatingAdd(T{1}, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1a8 = (uint *)0xf73098;
  local_1a0 = "";
  local_1b8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x248;
  file_14.m_begin = (iterator)&local_1a8;
  msg_14.m_end = pvVar2;
  msg_14.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_1b8,
             msg_14);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_1e8 = (uint *)CONCAT44(local_1e8._4_4_,0x7fffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1c8;
  local_1d8 = &local_1e8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1d8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_1c8 = &MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x248,
             &local_c0,"SaturatingAdd(MAXI, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1c8 = (uint *)0xf73098;
  local_1c0 = "";
  local_1d8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x24a;
  file_15.m_begin = (iterator)&local_1c8;
  msg_15.m_end = pvVar2;
  msg_15.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_1d8,
             msg_15);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_208 = (uint ****)((ulong)local_208 & 0xffffffff00000000);
  local_48 = (uint ***)0x100000000;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_1e8 = (uint *)&local_208;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1e8;
  local_1f8 = &local_48;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_1f8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xfc43f0,(size_t)&local_a0,0x24a,
             &local_c0,"CheckedAdd(T{0}, T{0}).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1e8 = (uint *)0xf73098;
  local_1e0 = "";
  local_1f8 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x24b;
  file_16.m_begin = (iterator)&local_1e8;
  msg_16.m_end = pvVar2;
  msg_16.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_1f8,
             msg_16);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_180 = "";
  local_58 = (uint ***)0x17fffffff;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_48;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_208;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_208 = &local_58;
  local_48 = (uint ***)&MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24b,
             &local_c0,"CheckedAdd(T{0}, MAXI).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_48 = (uint ***)0xf73098;
  local_40 = "";
  local_208 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x24c;
  file_17.m_begin = (iterator)&local_48;
  msg_17.m_end = pvVar2;
  msg_17.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_208,
             msg_17);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_180 = "";
  local_68 = (undefined8 **)0x17fffffff;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_218;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_218 = &local_68;
  local_a8 = (lazy_ostream *)&local_58;
  local_58 = (uint ***)&MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24c,
             &local_c0,"CheckedAdd(T{1}, MAXI - 1).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58 = (uint ***)0xf73098;
  local_50 = "";
  local_218 = (undefined8 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x24d;
  file_18.m_begin = (iterator)&local_58;
  msg_18.m_end = pvVar2;
  msg_18.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_218,
             msg_18);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_238 = (undefined8 *)CONCAT44(local_238._4_4_,0x7ffffffe);
  local_78 = (uint *)0x17ffffffe;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_68 = &local_238;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_228;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_228 = &local_78;
  local_a8 = (lazy_ostream *)&local_68;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b4a2,(size_t)&local_a0,0x24d,
             &local_c0,"CheckedAdd(T{1}, MAXI - 2).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_68 = (undefined8 **)0xf73098;
  local_60 = "";
  local_228 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x24e;
  file_19.m_begin = (iterator)&local_68;
  msg_19.m_end = pvVar2;
  msg_19.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_228,
             msg_19);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_248 = (char *)((ulong)local_248 & 0xffffffff00000000);
  local_258 = (undefined4 ***)((ulong)local_258 & 0xffffffff00000000);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_78 = (uint *)&local_248;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_238;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_238 = &local_258;
  local_a8 = (lazy_ostream *)&local_78;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xfc43f0,(size_t)&local_a0,0x24e,
             &local_c0,"SaturatingAdd(T{0}, T{0})",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_78 = (uint *)0xf73098;
  local_70 = "";
  local_238 = (undefined8 *)&boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x24f;
  file_20.m_begin = (iterator)&local_78;
  msg_20.m_end = pvVar2;
  msg_20.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_238,
             msg_20);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,0x7fffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_248;
  local_258 = &local_268;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_248 = (char *)&MAXI;
  local_d0 = (uint *****)&local_258;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x24f,
             &local_c0,"SaturatingAdd(T{0}, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (undefined4 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x250;
  file_21.m_begin = (iterator)&local_248;
  msg_21.m_end = pvVar2;
  msg_21.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_258,
             msg_21);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(MAXI == 0x7fffffff);
  local_180 = "";
  local_c8 = (undefined4 *)CONCAT44(local_c8._4_4_,0x7fffffff);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_268;
  local_278 = &local_c8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_278;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_268 = (undefined4 **)&MAXI;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b408,(size_t)&local_a0,0x250,
             &local_c0,"SaturatingAdd(T{1}, MAXI - 1)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_268 = (undefined4 **)0xf73098;
  local_260 = "";
  local_278 = (undefined4 **)&boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x251;
  file_22.m_begin = (iterator)&local_268;
  msg_22.m_end = pvVar2;
  msg_22.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_278,
             msg_22);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_27c = 0x7ffffffe;
  local_280 = 0x7ffffffe;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c8 = &local_27c;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_c8;
  local_f0 = &local_280;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_f0;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b4a2,(size_t)&local_a0,0x251,
             &local_c0,"SaturatingAdd(T{1}, MAXI - 2)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  MAXI = 0x80000000;
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6feac9;
  file_23.m_end = (iterator)0x25b;
  file_23.m_begin = (iterator)&local_108;
  msg_23.m_end = pvVar2;
  msg_23.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_118,
             msg_23);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(T{-1}, MINI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_128,0x25b);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar3 = 0x6feb92;
  file_24.m_end = (iterator)0x25c;
  file_24.m_begin = (iterator)&local_138;
  msg_24.m_end = pvVar2;
  msg_24.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_148,
             msg_24);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_198._0_8_ = "!CheckedAdd(MINI, MINI)";
  local_198._8_8_ = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae1c8;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x0;
  local_a8 = (lazy_ostream *)local_198;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,&local_c0,1,0,WARN,_cVar3,(size_t)&local_158,0x25c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x25d;
  file_25.m_begin = (iterator)&local_168;
  msg_25.m_end = pvVar2;
  msg_25.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_178,
             msg_25);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_1c8 = (uint *)CONCAT44(local_1c8._4_4_,0x80000000);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_1a8 = &MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1a8;
  local_1b8 = &local_1c8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1b8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x25d,
             &local_c0,"SaturatingAdd(T{-1}, MINI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1a8 = (uint *)0xf73098;
  local_1a0 = "";
  local_1b8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x25e;
  file_26.m_begin = (iterator)&local_1a8;
  msg_26.m_end = pvVar2;
  msg_26.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_1b8,
             msg_26);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_180 = "";
  local_1e8 = (uint *)CONCAT44(local_1e8._4_4_,0x80000000);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_1c8 = &MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1c8;
  local_1d8 = &local_1e8;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_1d8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x25e,
             &local_c0,"SaturatingAdd(MINI, MINI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1c8 = (uint *)0xf73098;
  local_1c0 = "";
  local_1d8 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x260;
  file_27.m_begin = (iterator)&local_1c8;
  msg_27.m_end = pvVar2;
  msg_27.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_1d8,
             msg_27);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_48 = (uint ***)0x180000000;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_1e8 = &MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_1e8;
  local_1f8 = &local_48;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = &local_1f8;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x260,
             &local_c0,"CheckedAdd(T{0}, MINI).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_1e8 = (uint *)0xf73098;
  local_1e0 = "";
  local_1f8 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x261;
  file_28.m_begin = (iterator)&local_1e8;
  msg_28.m_end = pvVar2;
  msg_28.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1f8,
             msg_28);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_180 = "";
  local_58 = (uint ***)0x180000000;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_48 = (uint ***)&MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_48;
  local_208 = &local_58;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_208;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x261,
             &local_c0,"CheckedAdd(T{-1}, MINI + 1).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_48 = (uint ***)0xf73098;
  local_40 = "";
  local_208 = (uint ****)&boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x262;
  file_29.m_begin = (iterator)&local_48;
  msg_29.m_end = pvVar2;
  msg_29.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_208,
             msg_29);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_228 = (uint **)CONCAT44(local_228._4_4_,0xffffffff);
  local_68 = (undefined8 **)0x1ffffffff;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_58 = &local_228;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_58;
  local_218 = &local_68;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_218;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0x1126110,(size_t)&local_a0,0x262,
             &local_c0,"CheckedAdd(MINI, MAXI).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_58 = (uint ***)0xf73098;
  local_50 = "";
  local_218 = (undefined8 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x263;
  file_30.m_begin = (iterator)&local_58;
  msg_30.m_end = pvVar2;
  msg_30.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_218,
             msg_30);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_238 = (undefined8 *)CONCAT44(local_238._4_4_,0x80000001);
  local_78 = (uint *)0x180000001;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_68 = &local_238;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_68;
  local_228 = &local_78;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_228;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b60b,(size_t)&local_a0,0x263,
             &local_c0,"CheckedAdd(T{-1}, MINI + 2).value()",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_68 = (undefined8 **)0xf73098;
  local_60 = "";
  local_228 = (uint **)&boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x264;
  file_31.m_begin = (iterator)&local_68;
  msg_31.m_end = pvVar2;
  msg_31.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_228,
             msg_31);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_248 = (char *)CONCAT44(local_248._4_4_,0x80000000);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_78 = &MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_78;
  local_238 = &local_248;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_238;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x264,
             &local_c0,"SaturatingAdd(T{0}, MINI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_78 = (uint *)0xf73098;
  local_70 = "";
  local_238 = (undefined8 *)&boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x265;
  file_32.m_begin = (iterator)&local_78;
  msg_32.m_end = pvVar2;
  msg_32.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_238,
             msg_32);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_180 = "";
  local_268 = (undefined4 **)CONCAT44(local_268._4_4_,0x80000000);
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_248 = (char *)&MAXI;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_248;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_258;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_258 = &local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b56f,(size_t)&local_a0,0x265,
             &local_c0,"SaturatingAdd(T{-1}, MINI + 1)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_240 = "";
  local_258 = (undefined4 ***)&boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x266;
  file_33.m_begin = (iterator)&local_248;
  msg_33.m_end = pvVar2;
  msg_33.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_258,
             msg_33);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_c8 = (undefined4 *)CONCAT44(local_c8._4_4_,0x80000001);
  local_f0 = (undefined4 *)CONCAT44(local_f0._4_4_,0x80000001);
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_268 = &local_c8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_278;
  pvVar1 = (iterator)0x1;
  pvVar2 = (iterator)0x2;
  local_278 = &local_f0;
  local_a8 = (lazy_ostream *)&local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0xf7b60b,(size_t)&local_a0,0x266,
             &local_c0,"SaturatingAdd(T{-1}, MINI + 2)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  local_268 = (undefined4 **)0xf73098;
  local_260 = "";
  local_278 = (undefined4 **)&boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x267;
  file_34.m_begin = (iterator)&local_268;
  msg_34.m_end = pvVar2;
  msg_34.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_278,
             msg_34);
  local_198._8_8_ = local_198._8_8_ & 0xffffffffffffff00;
  local_198._0_8_ = &PTR__lazy_ostream_013ae088;
  local_188 = boost::unit_test::lazy_ostream::inst;
  local_180 = "";
  local_27c = 0xffffffff;
  local_280 = 0xffffffff;
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_98 = "";
  local_c8 = &local_27c;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae248;
  local_b0 = boost::unit_test::lazy_ostream::inst;
  local_a8 = (lazy_ostream *)&local_c8;
  local_f0 = &local_280;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (uint *****)&local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_90,(lazy_ostream *)local_198,1,2,REQUIRE,0x1126110,(size_t)&local_a0,0x267,
             &local_c0,"SaturatingAdd(MINI, MAXI)",&local_e8);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_overflow)
{
    TestAddMatrixOverflow<unsigned>();
    TestAddMatrix<signed>();
}